

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Identifier.hpp
# Opt level: O0

void __thiscall Centaurus::Identifier::Identifier(Identifier *this,Stream *stream)

{
  Stream *stream_local;
  Identifier *this_local;
  
  this->_vptr_Identifier = (_func_int **)&PTR__Identifier_002c0ab0;
  std::__cxx11::wstring::wstring((wstring *)&this->m_id);
  parse(this,stream);
  return;
}

Assistant:

Identifier(Stream& stream)
    {
        parse(stream);
    }